

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

void __thiscall coins_tests::ccoins_flush_behavior::test_method(ccoins_flush_behavior *this)

{
  CoinsViewOptions options;
  bool bVar1;
  pointer pCVar2;
  FlushTest *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  *view;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  caches;
  CCoinsViewDB base;
  CCoinsViewDB *in_stack_fffffffffffffec8;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  *in_stack_fffffffffffffed0;
  DBParams *in_stack_fffffffffffffef0;
  CCoinsViewDB *in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  FlushTest *pFVar3;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  local_c0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined8 local_70;
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  CCoinsViewDB local_60;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar3 = in_RDI;
  fs::path::path((path *)0x5113c4,(char *)in_stack_fffffffffffffec8);
  local_70 = 0x800000;
  local_68 = 1;
  local_67 = 0;
  local_66 = 0;
  local_65 = 0;
  local_a8 = 0x1000000;
  local_a0 = 0;
  options._8_8_ = pFVar3;
  options.batch_write_bytes = in_stack_ffffffffffffff00;
  CCoinsViewDB::CCoinsViewDB(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,options);
  DBParams::~DBParams((DBParams *)in_stack_fffffffffffffec8);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::vector((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
            *)in_stack_fffffffffffffec8);
  std::make_unique<(anonymous_namespace)::CCoinsViewCacheTest,CCoinsViewDB*>
            ((CCoinsViewDB **)in_stack_fffffffffffffef0);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::push_back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               *)in_stack_fffffffffffffec8,(value_type *)0x51146e);
  std::
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 *)in_RDI);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          *)in_stack_fffffffffffffec8);
  std::
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  ::get((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
         *)in_stack_fffffffffffffec8);
  std::
  make_unique<(anonymous_namespace)::CCoinsViewCacheTest,(anonymous_namespace)::CCoinsViewCacheTest*>
            ((CCoinsViewCacheTest **)in_stack_fffffffffffffef0);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::push_back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               *)in_stack_fffffffffffffec8,(value_type *)0x5114b1);
  std::
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 *)in_RDI);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::begin(in_stack_fffffffffffffed0);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::end(in_stack_fffffffffffffed0);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>_>
                      ((__normal_iterator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>_>
                        *)in_stack_fffffffffffffed0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>_>
    ::operator*((__normal_iterator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>_>
                 *)in_stack_fffffffffffffec8);
    pCVar2 = std::
             unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ::get((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    *)in_stack_fffffffffffffec8);
    FlushTest::TestFlushBehavior(in_RDI,pCVar2,&local_60,&local_c0,false);
    pCVar2 = std::
             unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             ::get((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    *)in_stack_fffffffffffffec8);
    FlushTest::TestFlushBehavior(in_RDI,pCVar2,&local_60,&local_c0,true);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>_>
    ::operator++((__normal_iterator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>_>
                  *)in_stack_fffffffffffffec8);
  }
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::~vector((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
             *)in_RDI);
  CCoinsViewDB::~CCoinsViewDB(in_stack_fffffffffffffec8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(ccoins_flush_behavior, FlushTest)
{
    // Create two in-memory caches atop a leveldb view.
    CCoinsViewDB base{{.path = "test", .cache_bytes = 1 << 23, .memory_only = true}, {}};
    std::vector<std::unique_ptr<CCoinsViewCacheTest>> caches;
    caches.push_back(std::make_unique<CCoinsViewCacheTest>(&base));
    caches.push_back(std::make_unique<CCoinsViewCacheTest>(caches.back().get()));

    for (const auto& view : caches) {
        TestFlushBehavior(view.get(), base, caches, /*do_erasing_flush=*/false);
        TestFlushBehavior(view.get(), base, caches, /*do_erasing_flush=*/true);
    }
}